

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::DisconnectNode(CConnman *this,CSubNet *subnet)

{
  pointer ppCVar1;
  CNode *pCVar2;
  bool bVar3;
  Logger *this_00;
  char *in_RCX;
  pointer ppCVar4;
  bool bVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock93;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock93.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  criticalblock93.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock93.super_unique_lock);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar5 = false;
  for (ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    bVar3 = CSubNet::Match(subnet,(CNetAddr *)&pCVar2->addr);
    if (bVar3) {
      this_00 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      bVar5 = fLogIPs;
      if (bVar3) {
        if (fLogIPs == true) {
          CSubNet::ToString_abi_cxx11_(&local_78,subnet);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)0x84264f,(char *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
        }
        else {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
        }
        logging_function._M_str = "DisconnectNode";
        logging_function._M_len = 0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        in_RCX = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        LogPrintf_<std::__cxx11::string,long>
                  (logging_function,source_file,0xe20,
                   I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|CMPCTBLOCK|
                   REINDEX|ESTIMATEFEE|WALLETDB|ZMQ|HTTP|MEMPOOL,(Level)&local_58,
                   &stack0xffffffffffffff70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)subnet,
                   (long *)pCVar2->id);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((bVar5 != false) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2)) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      bVar5 = true;
      LOCK();
      (pCVar2->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock93.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CSubNet& subnet)
{
    bool disconnected = false;
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (subnet.Match(pnode->addr)) {
            LogDebug(BCLog::NET, "disconnect by subnet%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", subnet.ToString()) : ""), pnode->GetId());
            pnode->fDisconnect = true;
            disconnected = true;
        }
    }
    return disconnected;
}